

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O1

Value * duckdb::ParquetStatisticsUtils::ConvertValue
                  (Value *__return_storage_ptr__,LogicalType *type,ParquetColumnSchema *schema_ele,
                  string *stats)

{
  bool bVar1;
  string error;
  Value result;
  Value stats_val;
  LogicalType LStack_f8;
  string local_e0;
  LogicalType local_c0;
  Value local_a8;
  Value local_68;
  
  LogicalType::LogicalType(&local_c0,SQLNULL);
  Value::Value(&local_a8,&local_c0);
  LogicalType::~LogicalType(&local_c0);
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ConvertValueInternal(&local_68,type,schema_ele,stats);
  bVar1 = Value::DefaultTryCastAs(&local_68,type,&local_a8,&local_e0,false);
  if (bVar1) {
    Value::Value(__return_storage_ptr__,&local_a8);
  }
  else {
    LogicalType::LogicalType(&LStack_f8,type);
    Value::Value(__return_storage_ptr__,&LStack_f8);
    LogicalType::~LogicalType(&LStack_f8);
  }
  Value::~Value(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  Value::~Value(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Value ParquetStatisticsUtils::ConvertValue(const LogicalType &type, const ParquetColumnSchema &schema_ele,
                                           const std::string &stats) {
	Value result;
	string error;
	auto stats_val = ConvertValueInternal(type, schema_ele, stats);
	if (!stats_val.DefaultTryCastAs(type, result, &error)) {
		return Value(type);
	}
	return result;
}